

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.h
# Opt level: O2

void __thiscall
google::protobuf::internal::ArenaStringPtr::
Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
          (ArenaStringPtr *this,char *param_2,undefined8 param_3)

{
  allocator local_39;
  string local_38 [32];
  
  std::__cxx11::string::string(local_38,param_2,&local_39);
  Set(this,local_38,param_3);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void Set(FirstParam p1, const char* str, ::google::protobuf::Arena* arena) {
    Set(p1, ConstStringParam(str), arena);
  }